

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  size_t sVar1;
  bool bVar2;
  id tid_00;
  id tid;
  
  tid_00._M_thread = pthread_self();
  tid._M_thread = tid_00._M_thread;
  std::mutex::lock(&this->mtx_);
  if ((this->e_owner_)._M_thread != tid_00._M_thread) {
    bVar2 = is_shared_owner(this,tid_00);
    if (!bVar2) {
      sVar1 = (this->state_).rwcount;
      if (-1 < (long)sVar1) {
        rwlock::ReaderPrefer::acquire_rlock(&this->state_);
        std::vector<std::thread::id,_std::allocator<std::thread::id>_>::push_back
                  (&this->s_owner_,&tid);
        validator::deadlock::locked((uintptr_t)this,tid,true);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
      return -1 < (long)sVar1;
    }
  }
  abort();
}

Assistant:

bool try_lock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (e_owner_ == tid || is_shared_owner(tid)) {
      // non-recursive semantics
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::resource_deadlock_would_occur), "recursive try_lock_shared");
#endif
    }
    if (RwLockPolicy::wait_rlock(state_))
      return false;
    RwLockPolicy::acquire_rlock(state_);
    s_owner_.push_back(tid);
    validator::locked(reinterpret_cast<uintptr_t>(this), tid, true);
    return true;
  }